

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void render_bg_affine(gba_ppu_t *ppu,gba_color_t (*line) [240],BGCNT_t *bgcnt,_Bool win0in,
                     _Bool win1in,_Bool winout,_Bool objin,bg_referencepoint_container_t *x,
                     bg_referencepoint_container_t *y,bg_rotation_scaling_t *pa,
                     bg_rotation_scaling_t *pb,bg_rotation_scaling_t *pc,bg_rotation_scaling_t *pd)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  int screen_x;
  ulong uVar12;
  
  uVar1 = bgcnt->raw;
  uVar2 = *(uint *)(&DAT_00127020 + (ulong)(uVar1 >> 0xe) * 4);
  uVar12 = 0;
  do {
    uVar8 = (int)pc->sraw * (int)uVar12 + (y->current).raw >> 8;
    bVar4 = *(byte *)((long)bgcnt + 1) & 0x20;
    uVar10 = uVar2 - 1;
    if (bVar4 == 0) {
      uVar10 = 0xffffff;
    }
    uVar9 = (-(uint)(bVar4 == 0) | uVar2 - 1) & uVar8;
    if (uVar9 < uVar2) {
      uVar7 = (int)pa->sraw * (int)uVar12 + (x->current).raw >> 8;
      uVar10 = uVar10 & uVar7;
      if (uVar2 <= uVar10) goto LAB_00117349;
      uVar6 = ppu->y;
      if ((byte)(ppu->WIN0H).raw < uVar12 || uVar12 < (ppu->WIN0H).raw >> 8) {
        bVar11 = false;
      }
      else {
        bVar11 = uVar6 <= ((ppu->WIN0V).raw & 0xff) && (ppu->WIN0V).raw >> 8 <= uVar6;
      }
      if ((byte)(ppu->WIN1H).raw < uVar12 || uVar12 < (ppu->WIN1H).raw >> 8) {
        bVar5 = false;
      }
      else {
        bVar5 = uVar6 <= ((ppu->WIN1V).raw & 0xff) && (ppu->WIN1V).raw >> 8 <= uVar6;
      }
      uVar6 = (ppu->DISPCNT).raw;
      bVar3 = (byte)(uVar6 >> 8);
      bVar4 = win0in;
      if ((((bVar3 >> 5 & 1 & bVar11) == 0) && (bVar4 = win1in, (bVar3 >> 6 & 1 & bVar5) == 0)) &&
         ((-1 < (short)uVar6 || (bVar4 = objin, ppu->obj_window[uVar12] == false)))) {
        bVar4 = bVar11 | bVar5 | winout | (uVar6 & 0x6000) == 0;
      }
      if (bVar4 == 0) goto LAB_00117349;
      uVar6 = *(ushort *)
               (ppu->pram +
               (ulong)ppu->vram[(uint)ppu->vram[(ulong)((uVar9 >> 3) * (uVar2 >> 3)) +
                                                (ulong)((uVar10 >> 3) + ((uint)uVar1 * 8 & 0xf800))]
                                << 6 | (uVar7 & 7) + (uVar8 & 7) * 8 | (uVar1 & 0xc) << 0xc] * 2) &
              0x7fff | (ushort)(ppu->vram[(uint)ppu->vram[(ulong)((uVar9 >> 3) * (uVar2 >> 3)) +
                                                          (ulong)((uVar10 >> 3) +
                                                                 ((uint)uVar1 * 8 & 0xf800))] << 6 |
                                          (uVar7 & 7) + (uVar8 & 7) * 8 | (uVar1 & 0xc) << 0xc] == 0
                               ) << 0xf;
    }
    else {
LAB_00117349:
      uVar6 = *(ushort *)ppu->pram | 0x8000;
    }
    (*line)[uVar12].raw = uVar6;
    uVar12 = uVar12 + 1;
    if (uVar12 == 0xf0) {
      return;
    }
  } while( true );
}

Assistant:

void render_bg_affine(gba_ppu_t* ppu, gba_color_t (*line)[GBA_SCREEN_X], BGCNT_t* bgcnt,
                      bool win0in, bool win1in, bool winout, bool objin,
                      bg_referencepoint_container_t* x, bg_referencepoint_container_t* y,
                      bg_rotation_scaling_t* pa, bg_rotation_scaling_t* pb, bg_rotation_scaling_t* pc, bg_rotation_scaling_t* pd) {
    // Tileset (like pattern tables in the NES)
    word character_base_addr = bgcnt->character_base_block * CHARBLOCK_SIZE;
    // Tile map (like nametables in the NES)
    word screen_base_addr = bgcnt->screen_base_block * SCREENBLOCK_SIZE;

    int bg_width;
    int bg_height;
    switch (bgcnt->screen_size) {
        case 0:
            bg_width = 128;
            bg_height = 128;
            break;
        case 1:
            bg_width = 256;
            bg_height = 256;
            break;
        case 2:
            bg_width = 512;
            bg_height = 512;
            break;
        case 3:
            bg_width = 1024;
            bg_height = 1024;
            break;
        default:
            logfatal("Unimplemented screen size: %d", bgcnt->screen_size);
    }

    for (int screen_x = 0; screen_x < GBA_SCREEN_X; screen_x++) {
        word adjusted_x = (word)(x->current.sraw + pa->sraw * screen_x) >> 8;
        word adjusted_y = (word)(y->current.sraw + pc->sraw * screen_x) >> 8;

        if (bgcnt->wraparound) {
            adjusted_x %= bg_width;
            adjusted_y %= bg_height;
        }

        if (adjusted_y < bg_height && adjusted_x < bg_width && should_render_pixel_window(ppu, screen_x, ppu->y, win0in, win1in, winout, objin)) {
            int se_number = (adjusted_x / 8) + (adjusted_y / 8) * (bg_width / 8);
            byte tid = ppu->vram[screen_base_addr + se_number];
            render_tile(ppu, tid, 0, line, screen_x, true, character_base_addr, adjusted_x % 8, adjusted_y % 8);
        } else {
            (*line)[screen_x].raw = half_from_byte_array(ppu->pram, 0);
            (*line)[screen_x].transparent = true;
        }
    }
}